

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framing.c
# Opt level: O0

int ogg_sync_reset(ogg_sync_state *oy)

{
  int iVar1;
  ogg_sync_state *oy_local;
  
  iVar1 = ogg_sync_check(oy);
  if (iVar1 == 0) {
    oy->fill = 0;
    oy->returned = 0;
    oy->unsynced = 0;
    oy->headerbytes = 0;
    oy->bodybytes = 0;
    oy_local._4_4_ = 0;
  }
  else {
    oy_local._4_4_ = -1;
  }
  return oy_local._4_4_;
}

Assistant:

int ogg_sync_reset(ogg_sync_state *oy){
  if(ogg_sync_check(oy))return -1;

  oy->fill=0;
  oy->returned=0;
  oy->unsynced=0;
  oy->headerbytes=0;
  oy->bodybytes=0;
  return(0);
}